

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_widget_is_hovered(nk_context *ctx)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  nk_rect rect;
  nk_input *in_RDI;
  nk_rect bounds;
  nk_rect v;
  nk_rect c;
  float local_40;
  float fStackY_3c;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  nk_rect *in_stack_ffffffffffffffd0;
  nk_rect local_20;
  nk_input *local_10;
  nk_bool local_4;
  
  if (((in_RDI == (nk_input *)0x0) || (in_RDI[0x2e].keyboard.keys[5] == (nk_key)0x0)) ||
     (in_RDI[0x2e].keyboard.keys[4] != in_RDI[0x2e].keyboard.keys[5])) {
    local_4 = 0;
  }
  else {
    lVar1 = *(long *)((long)in_RDI[0x2e].keyboard.keys[5] + 0xa8);
    uVar2 = *(undefined8 *)(lVar1 + 0x44);
    uVar3 = *(undefined8 *)(lVar1 + 0x4c);
    local_20.x = (float)uVar2;
    local_20.x = (float)(int)local_20.x;
    local_20.y = (float)((ulong)uVar2 >> 0x20);
    local_20.y = (float)(int)local_20.y;
    local_20.w = (float)uVar3;
    local_20.w = (float)(int)local_20.w;
    local_20.h = (float)((ulong)uVar3 >> 0x20);
    local_20.h = (float)(int)local_20.h;
    local_10 = in_RDI;
    nk_layout_peek(in_stack_ffffffffffffffd0,
                   (nk_context *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    nk_unify((nk_rect *)&stack0xffffffffffffffd0,&local_20,local_40,fStackY_3c,
             local_40 + in_stack_ffffffffffffffc8,fStackY_3c + in_stack_ffffffffffffffcc);
    if (((local_20.x + local_20.w <= local_40) ||
        (local_40 + in_stack_ffffffffffffffc8 <= local_20.x)) ||
       ((local_20.y + local_20.h <= fStackY_3c ||
        (fStackY_3c + in_stack_ffffffffffffffcc <= local_20.y)))) {
      local_4 = 0;
    }
    else {
      rect.y = fStackY_3c;
      rect.x = local_40;
      rect.w = in_stack_ffffffffffffffc8;
      rect.h = in_stack_ffffffffffffffcc;
      local_4 = nk_input_is_mouse_hovering_rect(local_10,rect);
    }
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_widget_is_hovered(struct nk_context *ctx)
{
struct nk_rect c, v;
struct nk_rect bounds;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
if (!ctx || !ctx->current || ctx->active != ctx->current)
return 0;

c = ctx->current->layout->clip;
c.x = (float)((int)c.x);
c.y = (float)((int)c.y);
c.w = (float)((int)c.w);
c.h = (float)((int)c.h);

nk_layout_peek(&bounds, ctx);
nk_unify(&v, &c, bounds.x, bounds.y, bounds.x + bounds.w, bounds.y + bounds.h);
if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds.x, bounds.y, bounds.w, bounds.h))
return 0;
return nk_input_is_mouse_hovering_rect(&ctx->input, bounds);
}